

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

size_t prt_state(wchar_t row,wchar_t col)

{
  _Bool _Var1;
  ushort uVar2;
  wchar_t wVar3;
  size_t sVar4;
  char *fmt;
  char local_28 [16];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  _Var1 = player_is_resting(player);
  if (_Var1) {
    uVar2 = player_resting_count(player);
    my_strcpy(local_28,"Rest      ",0x10);
    if ((short)uVar2 < 1000) {
      if ((short)uVar2 < 100) {
        if ((short)uVar2 < 10) {
          if ((short)uVar2 < 1) {
            if (uVar2 == 0xfffd) {
              builtin_strncpy(local_28 + 5,"!!!!!",5);
            }
            else if (uVar2 == 0xfffe) {
              builtin_strncpy(local_28 + 5,"&&&&&",5);
            }
            else if (uVar2 == 0xffff) {
              builtin_strncpy(local_28 + 5,"*****",5);
            }
          }
          else {
            local_28[9] = (char)uVar2 + 0x30;
          }
        }
        else {
          local_28[9] = (byte)((uVar2 & 0xff) % 10) | 0x30;
          local_28[8] = (char)((uVar2 & 0xff) / 10) + 0x30;
        }
      }
      else {
        local_28[9] = (byte)(uVar2 % 10) | 0x30;
        local_28[8] = (byte)((uVar2 / 10 & 0xff) % 10) | 0x30;
        local_28[7] = (char)(uVar2 / 100) + 0x30;
      }
    }
    else {
      local_28[8] = 0x30;
      local_28[9] = 0x30;
      local_28[7] = (byte)((uVar2 / 100) % 10) | 0x30;
      local_28[6] = (byte)((uVar2 / 1000) % 10) | 0x30;
      if (9999 < uVar2) {
        local_28[5] = (byte)(uVar2 / 10000) | 0x30;
      }
    }
  }
  else {
    wVar3 = cmd_get_nrepeats();
    if (wVar3 != L'\0') {
      wVar3 = cmd_get_nrepeats();
      if (wVar3 < L'Ϩ') {
        fmt = "Repeat %3d";
      }
      else {
        wVar3 = (uint)wVar3 / 100;
        fmt = "Rep. %3d00";
      }
      strnfmt(local_28,0x10,fmt,(ulong)(uint)wVar3);
    }
  }
  c_put_str('\x01',local_28,row,col);
  sVar4 = strlen(local_28);
  return sVar4 + 1;
}

Assistant:

static size_t prt_state(int row, int col)
{
	uint8_t attr = COLOUR_WHITE;

	char text[16] = "";


	/* Displayed states are resting and repeating */
	if (player_is_resting(player)) {
		int i;
		int n = player_resting_count(player);

		/* Start with "Rest" */
		my_strcpy(text, "Rest      ", sizeof(text));

		/* Display according to length or intent of rest */
		if (n >= 1000) {
			i = n / 100;
			text[9] = '0';
			text[8] = '0';
			text[7] = I2D(i % 10);
			if (i >= 10) {
				i = i / 10;
				text[6] = I2D(i % 10);
				if (i >= 10)
					text[5] = I2D(i / 10);
			}
		} else if (n >= 100) {
			i = n;
			text[9] = I2D(i % 10);
			i = i / 10;
			text[8] = I2D(i % 10);
			text[7] = I2D(i / 10);
		} else if (n >= 10) {
			i = n;
			text[9] = I2D(i % 10);
			text[8] = I2D(i / 10);
		} else if (n > 0) {
			i = n;
			text[9] = I2D(i);
		} else if (n == REST_ALL_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '*';
		else if (n == REST_COMPLETE)
			text[5] = text[6] = text[7] = text[8] = text[9] = '&';
		else if (n == REST_SOME_POINTS)
			text[5] = text[6] = text[7] = text[8] = text[9] = '!';

	} else if (cmd_get_nrepeats()) {
		int nrepeats = cmd_get_nrepeats();

		if (nrepeats > 999)
			strnfmt(text, sizeof(text), "Rep. %3d00", nrepeats / 100);
		else
			strnfmt(text, sizeof(text), "Repeat %3d", nrepeats);
	}

	/* Display the info (or blanks) */
	c_put_str(attr, text, row, col);

	return strlen(text) + 1;
}